

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O2

void uv_os_free_environ(uv_env_item_t *envitems,int count)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar2 = 0;
  uVar1 = (ulong)(uint)count;
  if (count < 1) {
    uVar1 = uVar2;
  }
  for (; uVar1 * 0x10 != uVar2; uVar2 = uVar2 + 0x10) {
    uv__free(*(void **)((long)&envitems->name + uVar2));
  }
  uv__free(envitems);
  return;
}

Assistant:

void uv_os_free_environ(uv_env_item_t* envitems, int count) {
  int i;

  for (i = 0; i < count; i++) {
    uv__free(envitems[i].name);
  }

  uv__free(envitems);
}